

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

void Kit_DsdNtkFree(Kit_DsdNtk_t *pNtk)

{
  uint i;
  ulong uVar1;
  
  for (uVar1 = 0; (uVar1 < pNtk->nNodes && (pNtk->pNodes[uVar1] != (Kit_DsdObj_t *)0x0));
      uVar1 = uVar1 + 1) {
    free(pNtk->pNodes[uVar1]);
  }
  if (pNtk->pSupps != (uint *)0x0) {
    free(pNtk->pSupps);
    pNtk->pSupps = (uint *)0x0;
  }
  if (pNtk->pNodes != (Kit_DsdObj_t **)0x0) {
    free(pNtk->pNodes);
    pNtk->pNodes = (Kit_DsdObj_t **)0x0;
  }
  free(pNtk->pMem);
  free(pNtk);
  return;
}

Assistant:

void Kit_DsdNtkFree( Kit_DsdNtk_t * pNtk )
{
    Kit_DsdObj_t * pObj;
    unsigned i;
    Kit_DsdNtkForEachObj( pNtk, pObj, i )
        ABC_FREE( pObj );
    ABC_FREE( pNtk->pSupps );
    ABC_FREE( pNtk->pNodes );
    ABC_FREE( pNtk->pMem );
    ABC_FREE( pNtk );
}